

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::ProcessCommandLineArguments
          (cmCTestBuildAndTestHandler *this,string *currentArg,size_t *idx,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *allArgs)

{
  string *in_path;
  string *path;
  pointer pbVar1;
  cmCTest *this_00;
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ostream *poVar5;
  ulong uVar6;
  double dVar7;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  str._M_str = (currentArg->_M_dataplus)._M_p;
  str._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<17ul>(str,(char (*) [17])"--build-and-test");
  if (bVar2) {
    uVar4 = *idx;
    uVar6 = (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar4 < uVar6 - 1) {
      if (uVar6 <= uVar4 + 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                                 "--build-and-test must have source and binary dir");
        std::endl<char,std::char_traits<char>>(poVar5);
        this_00 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(this_00,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,400,local_1c8[0],false);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        return 0;
      }
      *idx = uVar4 + 1;
      in_path = &this->SourceDir;
      std::__cxx11::string::_M_assign((string *)in_path);
      *idx = *idx + 1;
      path = &this->BinaryDir;
      std::__cxx11::string::_M_assign((string *)path);
      cmsys::SystemTools::MakeDirectory(path,(mode_t *)0x0);
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,path);
      std::__cxx11::string::operator=((string *)path,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      cmsys::SystemTools::CollapseFullPath((string *)&cmCTestLog_msg,in_path);
      std::__cxx11::string::operator=((string *)in_path,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  str_00._M_str = (currentArg->_M_dataplus)._M_p;
  str_00._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<15ul>(str_00,(char (*) [15])"--build-target");
  if (bVar2) {
    pbVar1 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar3 = *idx + 1;
      *idx = sVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->BuildTargets,pbVar1 + sVar3);
    }
  }
  str_01._M_str = (currentArg->_M_dataplus)._M_p;
  str_01._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_01,(char (*) [16])"--build-nocmake");
  if (bVar2) {
    this->BuildNoCMake = true;
  }
  str_02._M_str = (currentArg->_M_dataplus)._M_p;
  str_02._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_02,(char (*) [16])"--build-run-dir");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildRunDir);
  }
  str_03._M_str = (currentArg->_M_dataplus)._M_p;
  str_03._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<19ul>(str_03,(char (*) [19])"--build-two-config");
  if (bVar2) {
    this->BuildTwoConfig = true;
  }
  str_04._M_str = (currentArg->_M_dataplus)._M_p;
  str_04._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_04,(char (*) [16])"--build-exe-dir");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ExecutableDirectory);
  }
  str_05._M_str = (currentArg->_M_dataplus)._M_p;
  str_05._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<15ul>(str_05,(char (*) [15])"--test-timeout");
  if (bVar2) {
    pbVar1 = (allArgs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*idx < ((long)(allArgs->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar3 = *idx + 1;
      *idx = sVar3;
      dVar7 = atof(pbVar1[sVar3]._M_dataplus._M_p);
      (this->Timeout).__r = dVar7;
    }
  }
  bVar2 = std::operator==(currentArg,"--build-generator");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGenerator);
  }
  bVar2 = std::operator==(currentArg,"--build-generator-platform");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorPlatform);
  }
  bVar2 = std::operator==(currentArg,"--build-generator-toolset");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildGeneratorToolset);
  }
  str_06._M_str = (currentArg->_M_dataplus)._M_p;
  str_06._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_06,(char (*) [16])"--build-project");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildProject);
  }
  str_07._M_str = (currentArg->_M_dataplus)._M_p;
  str_07._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<20ul>(str_07,(char (*) [20])"--build-makeprogram");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->BuildMakeProgram);
  }
  str_08._M_str = (currentArg->_M_dataplus)._M_p;
  str_08._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<22ul>(str_08,(char (*) [22])"--build-config-sample");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->ConfigSample);
  }
  str_09._M_str = (currentArg->_M_dataplus)._M_p;
  str_09._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_09,(char (*) [16])"--build-noclean");
  if (bVar2) {
    this->BuildNoClean = true;
  }
  str_10._M_str = (currentArg->_M_dataplus)._M_p;
  str_10._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<16ul>(str_10,(char (*) [16])"--build-options");
  if (bVar2) {
    while( true ) {
      pbVar1 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((((ulong)((long)(allArgs->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
            *idx + 1) || (bVar2 = std::operator!=(pbVar1 + *idx + 1,"--build-target"), !bVar2)) ||
         (bVar2 = std::operator!=((allArgs->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + *idx + 1,
                                  "--test-command"), !bVar2)) break;
      sVar3 = *idx;
      *idx = sVar3 + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->BuildOptions,
                  (allArgs->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + sVar3 + 1);
    }
  }
  str_11._M_str = (currentArg->_M_dataplus)._M_p;
  str_11._M_len = currentArg->_M_string_length;
  bVar2 = cmHasLiteralPrefix<15ul>(str_11,(char (*) [15])"--test-command");
  if ((bVar2) &&
     (*idx < ((long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(allArgs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
    *idx = *idx + 1;
    std::__cxx11::string::_M_assign((string *)&this->TestCommand);
    while( true ) {
      uVar4 = *idx + 1;
      pbVar1 = (allArgs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(allArgs->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4)
      break;
      *idx = uVar4;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->TestCommandArgs,pbVar1 + uVar4);
    }
  }
  return 1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessCommandLineArguments(
  const std::string& currentArg, size_t& idx,
  const std::vector<std::string>& allArgs)
{
  // --build-and-test options
  if (cmHasLiteralPrefix(currentArg, "--build-and-test") &&
      idx < allArgs.size() - 1) {
    if (idx + 2 < allArgs.size()) {
      idx++;
      this->SourceDir = allArgs[idx];
      idx++;
      this->BinaryDir = allArgs[idx];
      // dir must exist before CollapseFullPath is called
      cmSystemTools::MakeDirectory(this->BinaryDir);
      this->BinaryDir = cmSystemTools::CollapseFullPath(this->BinaryDir);
      this->SourceDir = cmSystemTools::CollapseFullPath(this->SourceDir);
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "--build-and-test must have source and binary dir"
                   << std::endl);
      return 0;
    }
  }
  if (cmHasLiteralPrefix(currentArg, "--build-target") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildTargets.push_back(allArgs[idx]);
  }
  if (cmHasLiteralPrefix(currentArg, "--build-nocmake")) {
    this->BuildNoCMake = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-run-dir") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildRunDir = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-two-config")) {
    this->BuildTwoConfig = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-exe-dir") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->ExecutableDirectory = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--test-timeout") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->Timeout = cmDuration(atof(allArgs[idx].c_str()));
  }
  if (currentArg == "--build-generator" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGenerator = allArgs[idx];
  }
  if (currentArg == "--build-generator-platform" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGeneratorPlatform = allArgs[idx];
  }
  if (currentArg == "--build-generator-toolset" && idx < allArgs.size() - 1) {
    idx++;
    this->BuildGeneratorToolset = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-project") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildProject = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-makeprogram") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->BuildMakeProgram = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-config-sample") &&
      idx < allArgs.size() - 1) {
    idx++;
    this->ConfigSample = allArgs[idx];
  }
  if (cmHasLiteralPrefix(currentArg, "--build-noclean")) {
    this->BuildNoClean = true;
  }
  if (cmHasLiteralPrefix(currentArg, "--build-options")) {
    while (idx + 1 < allArgs.size() && allArgs[idx + 1] != "--build-target" &&
           allArgs[idx + 1] != "--test-command") {
      ++idx;
      this->BuildOptions.push_back(allArgs[idx]);
    }
  }
  if (cmHasLiteralPrefix(currentArg, "--test-command") &&
      idx < allArgs.size() - 1) {
    ++idx;
    this->TestCommand = allArgs[idx];
    while (idx + 1 < allArgs.size()) {
      ++idx;
      this->TestCommandArgs.push_back(allArgs[idx]);
    }
  }
  return 1;
}